

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

void P_RunEffects(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  AActor *pAVar4;
  undefined1 local_30 [4];
  int rnum;
  TThinkerIterator<AActor> iterator;
  AActor *actor;
  int pnum;
  
  bVar1 = TObjPtr<AActor>::operator==
                    ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0),(AActor *)0x0)
  ;
  if (!bVar1) {
    pAVar4 = TObjPtr<AActor>::operator->
                       ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    iVar2 = (int)(((long)pAVar4->Sector - (long)sectors) / 0x218) * numsectors;
    TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)local_30,0x80);
    while (iterator.super_FThinkerIterator._16_8_ =
                TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)local_30,false),
          (AActor *)iterator.super_FThinkerIterator._16_8_ != (AActor *)0x0) {
      if ((((AActor *)iterator.super_FThinkerIterator._16_8_)->effects != 0) &&
         ((iVar3 = iVar2 + (int)(((long)((AActor *)iterator.super_FThinkerIterator._16_8_)->Sector -
                                 (long)sectors) / 0x218), rejectmatrix == (BYTE *)0x0 ||
          (((uint)rejectmatrix[iVar3 >> 3] & 1 << ((byte)iVar3 & 7)) == 0)))) {
        P_RunEffect((AActor *)iterator.super_FThinkerIterator._16_8_,
                    ((AActor *)iterator.super_FThinkerIterator._16_8_)->effects);
      }
    }
  }
  return;
}

Assistant:

void P_RunEffects ()
{
	if (players[consoleplayer].camera == NULL) return;

	int	pnum = int(players[consoleplayer].camera->Sector - sectors) * numsectors;

	AActor *actor;
	TThinkerIterator<AActor> iterator;

	while ( (actor = iterator.Next ()) )
	{
		if (actor->effects)
		{
			// Only run the effect if the actor is potentially visible
			int rnum = pnum + int(actor->Sector - sectors);
			if (rejectmatrix == NULL || !(rejectmatrix[rnum>>3] & (1 << (rnum & 7))))
				P_RunEffect (actor, actor->effects);
		}
	}
}